

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

RPCHelpMan * estimaterawfee(void)

{
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_20;
  string description_21;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  undefined4 in_stack_ffffffffffffe7e8;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffe7ec;
  undefined1 in_stack_ffffffffffffe7f0 [24];
  undefined8 in_stack_ffffffffffffe808;
  undefined8 in_stack_ffffffffffffe810;
  _Manager_type in_stack_ffffffffffffe818;
  undefined8 in_stack_ffffffffffffe820;
  undefined1 in_stack_ffffffffffffe828 [16];
  pointer in_stack_ffffffffffffe838;
  pointer pRVar10;
  pointer in_stack_ffffffffffffe840;
  pointer pRVar11;
  pointer in_stack_ffffffffffffe848;
  pointer pRVar12;
  pointer in_stack_ffffffffffffe850;
  undefined1 in_stack_ffffffffffffe858 [16];
  pointer in_stack_ffffffffffffe868;
  undefined8 in_stack_ffffffffffffe870;
  pointer in_stack_ffffffffffffe878;
  pointer pRVar13;
  pointer in_stack_ffffffffffffe880;
  pointer pRVar14;
  pointer in_stack_ffffffffffffe888;
  pointer pRVar15;
  _Invoker_type in_stack_ffffffffffffe890;
  undefined1 in_stack_ffffffffffffe898 [32];
  pointer in_stack_ffffffffffffe8b8;
  pointer in_stack_ffffffffffffe8c0;
  pointer in_stack_ffffffffffffe8c8;
  allocator<char> local_172a;
  allocator<char> local_1729;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1728;
  allocator<char> local_170b;
  allocator<char> local_170a;
  allocator_type local_1709;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1708;
  allocator<char> local_16ea;
  allocator<char> local_16e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16e8;
  allocator<char> local_16cb;
  allocator<char> local_16ca;
  allocator_type local_16c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16c8;
  allocator<char> local_16aa;
  allocator<char> local_16a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16a8;
  allocator<char> local_168a;
  allocator<char> local_1689;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1688;
  allocator<char> local_166a;
  allocator<char> local_1669;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1668;
  allocator<char> local_164a;
  allocator<char> local_1649;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1648;
  allocator<char> local_162a;
  allocator<char> local_1629;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1628;
  allocator<char> local_160a;
  allocator<char> local_1609;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1608;
  allocator<char> local_15ea;
  allocator<char> local_15e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15e8;
  allocator<char> local_15ca;
  allocator<char> local_15c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15c8;
  allocator<char> local_15aa;
  allocator<char> local_15a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15a8;
  allocator<char> local_1581;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1580;
  allocator<char> local_1562;
  allocator<char> local_1561;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1560;
  allocator<char> local_1542;
  allocator<char> local_1541;
  RPCResults local_1540;
  allocator_type local_1522;
  allocator<char> local_1521;
  double local_1520;
  allocator<char> local_1513;
  allocator<char> local_1512;
  allocator<char> local_1511;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1510;
  allocator<char> local_14f2;
  allocator<char> local_14f1;
  string local_14f0;
  string local_14d0;
  string local_14b0;
  char *local_1490;
  size_type local_1488;
  char local_1480 [8];
  undefined8 uStack_1478;
  string local_1470 [32];
  string local_1450 [32];
  RPCResult local_1430;
  string local_13a8 [32];
  string local_1388 [32];
  string local_1368 [32];
  string local_1348 [32];
  RPCResult local_1328;
  string local_12a0 [32];
  string local_1280 [32];
  string local_1260 [32];
  string local_1240 [32];
  RPCResult local_1220;
  string local_1198 [32];
  string local_1178 [32];
  string local_1158 [32];
  string local_1138 [32];
  RPCResult local_1118;
  string local_1090 [32];
  string local_1070 [32];
  string local_1050 [32];
  undefined8 local_1030 [4];
  string local_1010 [32];
  string local_ff0 [32];
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  string local_f70 [32];
  string local_f50 [32];
  string local_f30 [32];
  string local_f10 [32];
  string local_ef0 [32];
  RPCResult local_ed0 [4];
  RPCResult local_cb0;
  RPCResult local_c28;
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  string local_aa0 [32];
  RPCResult local_a80 [4];
  RPCResult local_860;
  RPCResult local_7d8;
  string local_750 [32];
  string local_730 [32];
  RPCResult local_710 [3];
  string local_578 [32];
  string local_558 [32];
  RPCResult local_538;
  RPCArgOptions local_4b0;
  string local_468 [32];
  UniValue local_448;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  string local_390 [32];
  RPCArgOptions local_370;
  string local_328 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  string local_2a8 [32];
  RPCArg local_288 [2];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030[0] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"estimaterawfee",&local_14f1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nWARNING: This interface is unstable and may disappear or change!\n\nWARNING: This is an advanced API call that is tightly coupled to the specific\nimplementation of fee estimation. The parameters it can be called with\nand the results it returns will change if the internal implementation changes.\n\nEstimates the approximate fee per kilobyte needed for a transaction to begin\nconfirmation within conf_target blocks if possible. Uses virtual transaction size as\ndefined in BIP 141 (witness data is discounted).\n"
             ,&local_14f2);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"conf_target",&local_1511);
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"Confirmation target in blocks (1 - 1008)",&local_1512);
  local_370.oneline_description._M_dataplus._M_p = (pointer)&local_370.oneline_description.field_2;
  local_370.skip_type_check = false;
  local_370.oneline_description._M_string_length = 0;
  local_370.oneline_description.field_2._M_local_buf[0] = '\0';
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_370._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe7e8;
  name._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffe7f0._8_16_;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe810;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe808;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe818;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe820;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe828;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe838;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe840;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe848;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe850;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe858;
  description_20._M_string_length = in_stack_ffffffffffffe870;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_20.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_20.field_2._8_8_ = in_stack_ffffffffffffe880;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe890;
  opts._0_8_ = in_stack_ffffffffffffe888;
  opts.oneline_description._M_string_length = in_stack_ffffffffffffe898._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe898._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe898._24_8_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe8b8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe8c0;
  opts._64_8_ = in_stack_ffffffffffffe8c8;
  RPCArg::RPCArg(local_288,name,(Type)local_2a8,fallback,description_20,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_390,"threshold",&local_1513);
  local_1520 = 0.95;
  UniValue::UniValue<double,_double,_true>(&local_448,&local_1520);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_3f0,&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            (local_468,
             "The proportion of transactions in a given feerate range that must have been\nconfirmed within conf_target in order to consider those feerates as high enough and proceed to check\nlower buckets."
             ,&local_1521);
  local_4b0.oneline_description._M_dataplus._M_p = (pointer)&local_4b0.oneline_description.field_2;
  local_4b0.skip_type_check = false;
  local_4b0.oneline_description._M_string_length = 0;
  local_4b0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_4b0._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe7e8;
  name_00._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe810;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe808;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe818;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe820;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe828;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe838;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe840;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe848;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe850;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffe858;
  description_21._M_string_length = in_stack_ffffffffffffe870;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_21.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_21.field_2._8_8_ = in_stack_ffffffffffffe880;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe890;
  opts_00._0_8_ = in_stack_ffffffffffffe888;
  opts_00.oneline_description._M_string_length = in_stack_ffffffffffffe898._0_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe898._8_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe898._24_8_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe8b8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe8c0;
  opts_00._64_8_ = in_stack_ffffffffffffe8c8;
  RPCArg::RPCArg(local_288 + 1,name_00,(Type)local_390,fallback_00,description_21,opts_00);
  __l._M_len = 2;
  __l._M_array = local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1510,__l,&local_1522);
  std::__cxx11::string::string<std::allocator<char>>(local_558,"",&local_1541);
  std::__cxx11::string::string<std::allocator<char>>
            (local_578,
             "Results are returned for any horizon which tracks blocks up to the confirmation target"
             ,&local_1542);
  std::__cxx11::string::string<std::allocator<char>>(local_730,"short",&local_1561);
  std::__cxx11::string::string<std::allocator<char>>
            (local_750,"estimate for short time horizon",&local_1562);
  std::__cxx11::string::string<std::allocator<char>>(local_aa0,"feerate",&local_1581);
  std::operator+(&local_ae0,"estimate fee rate in ",&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_ac0,&local_ae0,"/kvB");
  local_15a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  auVar1._4_24_ = in_stack_ffffffffffffe7f0;
  auVar1._0_4_ = in_stack_ffffffffffffe7ec;
  auVar1._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffe810;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe838;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (local_a80,NUM,(string)(auVar1 << 0x20),SUB81(local_aa0,0),description,inner,true);
  std::__cxx11::string::string<std::allocator<char>>(local_b00,"decay",&local_15a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b20,
             "exponential decay (per block) for historical moving average of confirmation data",
             &local_15aa);
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_00._M_string_length = in_stack_ffffffffffffe810;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(local_a80 + 1,NUM,m_key_name,description_00,inner_00,false);
  std::__cxx11::string::string<std::allocator<char>>(local_b40,"scale",&local_15c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b60,"The resolution of confirmation targets at this time horizon",&local_15ca);
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_00._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_01._M_string_length = in_stack_ffffffffffffe810;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(local_a80 + 2,NUM,m_key_name_00,description_01,inner_01,SUB81(local_b40,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b80,"pass",&local_15e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ba0,
             "information about the lowest range of feerates to succeed in meeting the threshold",
             &local_15ea);
  std::__cxx11::string::string<std::allocator<char>>(local_ef0,"startrange",&local_1609);
  std::__cxx11::string::string<std::allocator<char>>(local_f10,"start of feerate range",&local_160a)
  ;
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_01._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_02._M_string_length = in_stack_ffffffffffffe810;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(local_ed0,NUM,m_key_name_01,description_02,inner_02,SUB81(local_ef0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f30,"endrange",&local_1629);
  std::__cxx11::string::string<std::allocator<char>>(local_f50,"end of feerate range",&local_162a);
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_02._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_03._M_string_length = in_stack_ffffffffffffe810;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(local_ed0 + 1,NUM,m_key_name_02,description_03,inner_03,SUB81(local_f30,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f70,"withintarget",&local_1649);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f90,
             "number of txs over history horizon in the feerate range that were confirmed within target"
             ,&local_164a);
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_03._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_04._M_string_length = in_stack_ffffffffffffe810;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(local_ed0 + 2,NUM,m_key_name_03,description_04,inner_04,SUB81(local_f70,0));
  std::__cxx11::string::string<std::allocator<char>>(local_fb0,"totalconfirmed",&local_1669);
  std::__cxx11::string::string<std::allocator<char>>
            (local_fd0,
             "number of txs over history horizon in the feerate range that were confirmed at any point"
             ,&local_166a);
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_04._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_05._M_string_length = in_stack_ffffffffffffe810;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(local_ed0 + 3,NUM,m_key_name_04,description_05,inner_05,SUB81(local_fb0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_ff0,"inmempool",&local_1689);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1010,
             "current number of txs in mempool in the feerate range unconfirmed for at least target blocks"
             ,&local_168a);
  local_16a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_05._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_06._M_string_length = in_stack_ffffffffffffe810;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(&local_cb0,NUM,m_key_name_05,description_06,inner_06,SUB81(local_ff0,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1030,"leftmempool",&local_16a9)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1050,
             "number of txs over history horizon in the feerate range that left mempool unconfirmed after target"
             ,&local_16aa);
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_06._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_07._M_string_length = in_stack_ffffffffffffe810;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(&local_c28,NUM,m_key_name_06,description_07,inner_07,SUB81(local_1030,0));
  __l_00._M_len = 6;
  __l_00._M_array = local_ed0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1608,__l_00,&local_16c9);
  uVar9 = 0;
  auVar2._4_24_ = in_stack_ffffffffffffe7f0;
  auVar2._0_4_ = in_stack_ffffffffffffe7ec;
  auVar2._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffe810;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (local_a80 + 3,OBJ,(string)(auVar2 << 0x20),SUB81(local_b80,0),description_08,inner_08,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1070,"fail",&local_16ca);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1090,
             "information about the highest range of feerates to fail to meet the threshold",
             &local_16cb);
  std::__cxx11::string::string<std::allocator<char>>(local_1138,"",&local_16e9);
  std::__cxx11::string::string<std::allocator<char>>(local_1158,"",&local_16ea);
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_07._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_09._M_string_length = in_stack_ffffffffffffe810;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (&local_1118,ELISION,m_key_name_07,description_09,inner_09,SUB81(local_1138,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1118;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_16e8,__l_01,&local_1709);
  uVar9 = 0;
  auVar3._4_24_ = in_stack_ffffffffffffe7f0;
  auVar3._0_4_ = in_stack_ffffffffffffe7ec;
  auVar3._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffe810;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (&local_860,OBJ,(string)(auVar3 << 0x20),SUB81(local_1070,0),description_10,inner_10,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1178,"errors",&local_170a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1198,"Errors encountered during processing (if there are any)",&local_170b);
  std::__cxx11::string::string<std::allocator<char>>(local_1240,"error",&local_1729);
  std::__cxx11::string::string<std::allocator<char>>(local_1260,"",&local_172a);
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_08._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_08.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_11._M_string_length = in_stack_ffffffffffffe810;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(&local_1220,STR,m_key_name_08,description_11,inner_11,SUB81(local_1240,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_1220;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1728,__l_02,(allocator_type *)&stack0xffffffffffffe8b7);
  auVar4._4_24_ = in_stack_ffffffffffffe7f0;
  auVar4._0_4_ = in_stack_ffffffffffffe7ec;
  auVar4._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffe810;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (&local_7d8,ARR,(string)(auVar4 << 0x20),SUB81(local_1178,0),description_12,inner_12,
             true);
  __l_03._M_len = 6;
  __l_03._M_array = local_a80;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1580,__l_03,(allocator_type *)&stack0xffffffffffffe8b6);
  uVar9 = 0;
  auVar5._4_24_ = in_stack_ffffffffffffe7f0;
  auVar5._0_4_ = in_stack_ffffffffffffe7ec;
  auVar5._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffe810;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (local_710,OBJ,(string)(auVar5 << 0x20),SUB81(local_730,0),description_13,inner_13,true)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1280,"medium",(allocator<char> *)&stack0xffffffffffffe8b5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_12a0,"estimate for medium time horizon",
             (allocator<char> *)&stack0xffffffffffffe8b4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1348,"",(allocator<char> *)&stack0xffffffffffffe897);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1368,"",(allocator<char> *)&stack0xffffffffffffe896);
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_09._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_09.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_14._M_string_length = in_stack_ffffffffffffe810;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (&local_1328,ELISION,m_key_name_09,description_14,inner_14,SUB81(local_1348,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_1328;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe898,__l_04,
             (allocator_type *)&stack0xffffffffffffe877);
  uVar9 = 0;
  auVar6._4_24_ = in_stack_ffffffffffffe7f0;
  auVar6._0_4_ = in_stack_ffffffffffffe7ec;
  auVar6._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffe810;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_15.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe838;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (local_710 + 1,OBJ,(string)(auVar6 << 0x20),SUB81(local_1280,0),description_15,inner_15,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1388,"long",(allocator<char> *)&stack0xffffffffffffe876);
  std::__cxx11::string::string<std::allocator<char>>
            (local_13a8,"estimate for long time horizon",(allocator<char> *)&stack0xffffffffffffe875
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_1450,"",(allocator<char> *)&stack0xffffffffffffe857);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1470,"",(allocator<char> *)&stack0xffffffffffffe856);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_10._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_10.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_16._M_string_length = in_stack_ffffffffffffe810;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_16.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (&local_1430,ELISION,m_key_name_10,description_16,inner_16,SUB81(local_1450,0));
  __l_05._M_len = 1;
  __l_05._M_array = &local_1430;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe858,__l_05,
             (allocator_type *)&stack0xffffffffffffe837);
  uVar9 = 0;
  auVar7._4_24_ = in_stack_ffffffffffffe7f0;
  auVar7._0_4_ = in_stack_ffffffffffffe7ec;
  auVar7._28_4_ = 0;
  description_17._M_string_length = in_stack_ffffffffffffe810;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_17.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult
            (local_710 + 2,OBJ,(string)(auVar7 << 0x20),SUB81(local_1388,0),description_17,inner_17,
             true);
  __l_06._M_len = 3;
  __l_06._M_array = local_710;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1560,__l_06,(allocator_type *)&stack0xffffffffffffe836);
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe7ec;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_11._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  m_key_name_11.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  description_18._M_string_length = in_stack_ffffffffffffe810;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe808;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe818;
  description_18.field_2._8_8_ = in_stack_ffffffffffffe820;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe828._0_8_;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe828._8_8_;
  RPCResult::RPCResult(&local_538,OBJ,m_key_name_11,description_18,inner_18,SUB81(local_558,0));
  result._4_4_ = in_stack_ffffffffffffe7ec;
  result.m_type = uVar9;
  result.m_key_name._0_24_ = in_stack_ffffffffffffe7f0;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe808;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe810;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe818;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe820;
  result.m_optional = (bool)in_stack_ffffffffffffe828[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffe828[1];
  result._66_6_ = in_stack_ffffffffffffe828._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe828._8_8_;
  result.m_description._M_string_length = (size_type)pRVar10;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar11;
  result.m_description.field_2._8_8_ = pRVar12;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe850;
  result.m_cond._8_16_ = in_stack_ffffffffffffe858;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffe868;
  RPCResults::RPCResults(&local_1540,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14d0,"estimaterawfee",(allocator<char> *)&stack0xffffffffffffe835);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14f0,"6 0.9",(allocator<char> *)&stack0xffffffffffffe834);
  HelpExampleCli(&local_14b0,&local_14d0,&local_14f0);
  local_1490 = local_1480;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b0._M_dataplus._M_p == &local_14b0.field_2) {
    uStack_1478 = local_14b0.field_2._8_8_;
  }
  else {
    local_1490 = local_14b0._M_dataplus._M_p;
  }
  local_1488 = local_14b0._M_string_length;
  local_14b0._M_string_length = 0;
  local_14b0.field_2._M_local_buf[0] = '\0';
  name_01._M_string_length = in_stack_ffffffffffffe7f0._0_8_;
  name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe7f0._8_16_;
  name_01._M_dataplus._M_p = &stack0xffffffffffffe808;
  description_19.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/fees.cpp:151:9)>
       ::_M_manager;
  description_19._M_dataplus._M_p = (pointer)0x0;
  description_19._M_string_length = 0;
  description_19.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/fees.cpp:151:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar10;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe828._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe828._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe850;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe868;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe858._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffe858._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe870;
  fun.super__Function_base._M_functor._8_8_ = pRVar14;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar13;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar15;
  fun._M_invoker = in_stack_ffffffffffffe890;
  local_14b0._M_dataplus._M_p = (pointer)&local_14b0.field_2;
  RPCHelpMan::RPCHelpMan(in_RDI,name_01,description_19,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe808);
  std::__cxx11::string::~string((string *)&local_1490);
  std::__cxx11::string::~string((string *)&local_14b0);
  std::__cxx11::string::~string((string *)&local_14f0);
  std::__cxx11::string::~string((string *)&local_14d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1540.m_results);
  RPCResult::~RPCResult(&local_538);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1560);
  lVar8 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_710[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe858);
  RPCResult::~RPCResult(&local_1430);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe838);
  std::__cxx11::string::~string(local_1470);
  std::__cxx11::string::~string(local_1450);
  std::__cxx11::string::~string(local_13a8);
  std::__cxx11::string::~string(local_1388);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe898);
  RPCResult::~RPCResult(&local_1328);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe878);
  std::__cxx11::string::~string(local_1368);
  std::__cxx11::string::~string(local_1348);
  std::__cxx11::string::~string(local_12a0);
  std::__cxx11::string::~string(local_1280);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1580);
  lVar8 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_a80[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1728);
  RPCResult::~RPCResult(&local_1220);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8b8);
  std::__cxx11::string::~string(local_1260);
  std::__cxx11::string::~string(local_1240);
  std::__cxx11::string::~string(local_1198);
  std::__cxx11::string::~string(local_1178);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16e8);
  RPCResult::~RPCResult(&local_1118);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1708);
  std::__cxx11::string::~string(local_1158);
  std::__cxx11::string::~string(local_1138);
  std::__cxx11::string::~string(local_1090);
  std::__cxx11::string::~string(local_1070);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1608);
  lVar8 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_ed0[0].m_type + lVar8));
    lVar8 = lVar8 + -0x88;
  } while (lVar8 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16c8);
  std::__cxx11::string::~string(local_1050);
  std::__cxx11::string::~string((string *)local_1030);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16a8);
  std::__cxx11::string::~string(local_1010);
  std::__cxx11::string::~string(local_ff0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1688);
  std::__cxx11::string::~string(local_fd0);
  std::__cxx11::string::~string(local_fb0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1668);
  std::__cxx11::string::~string(local_f90);
  std::__cxx11::string::~string(local_f70);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1648);
  std::__cxx11::string::~string(local_f50);
  std::__cxx11::string::~string(local_f30);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1628);
  std::__cxx11::string::~string(local_f10);
  std::__cxx11::string::~string(local_ef0);
  std::__cxx11::string::~string(local_ba0);
  std::__cxx11::string::~string(local_b80);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15e8);
  std::__cxx11::string::~string(local_b60);
  std::__cxx11::string::~string(local_b40);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15c8);
  std::__cxx11::string::~string(local_b20);
  std::__cxx11::string::~string(local_b00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15a8);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string(local_aa0);
  std::__cxx11::string::~string(local_750);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_558);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1510);
  lVar8 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_288[0].m_names._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x108;
  } while (lVar8 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_4b0);
  std::__cxx11::string::~string(local_468);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_3f0);
  UniValue::~UniValue(&local_448);
  std::__cxx11::string::~string(local_390);
  RPCArgOptions::~RPCArgOptions(&local_370);
  std::__cxx11::string::~string(local_328);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan estimaterawfee()
{
    return RPCHelpMan{"estimaterawfee",
        "\nWARNING: This interface is unstable and may disappear or change!\n"
        "\nWARNING: This is an advanced API call that is tightly coupled to the specific\n"
        "implementation of fee estimation. The parameters it can be called with\n"
        "and the results it returns will change if the internal implementation changes.\n"
        "\nEstimates the approximate fee per kilobyte needed for a transaction to begin\n"
        "confirmation within conf_target blocks if possible. Uses virtual transaction size as\n"
        "defined in BIP 141 (witness data is discounted).\n",
        {
            {"conf_target", RPCArg::Type::NUM, RPCArg::Optional::NO, "Confirmation target in blocks (1 - 1008)"},
            {"threshold", RPCArg::Type::NUM, RPCArg::Default{0.95}, "The proportion of transactions in a given feerate range that must have been\n"
            "confirmed within conf_target in order to consider those feerates as high enough and proceed to check\n"
            "lower buckets."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "Results are returned for any horizon which tracks blocks up to the confirmation target",
            {
                {RPCResult::Type::OBJ, "short", /*optional=*/true, "estimate for short time horizon",
                    {
                        {RPCResult::Type::NUM, "feerate", /*optional=*/true, "estimate fee rate in " + CURRENCY_UNIT + "/kvB"},
                        {RPCResult::Type::NUM, "decay", "exponential decay (per block) for historical moving average of confirmation data"},
                        {RPCResult::Type::NUM, "scale", "The resolution of confirmation targets at this time horizon"},
                        {RPCResult::Type::OBJ, "pass", /*optional=*/true, "information about the lowest range of feerates to succeed in meeting the threshold",
                        {
                                {RPCResult::Type::NUM, "startrange", "start of feerate range"},
                                {RPCResult::Type::NUM, "endrange", "end of feerate range"},
                                {RPCResult::Type::NUM, "withintarget", "number of txs over history horizon in the feerate range that were confirmed within target"},
                                {RPCResult::Type::NUM, "totalconfirmed", "number of txs over history horizon in the feerate range that were confirmed at any point"},
                                {RPCResult::Type::NUM, "inmempool", "current number of txs in mempool in the feerate range unconfirmed for at least target blocks"},
                                {RPCResult::Type::NUM, "leftmempool", "number of txs over history horizon in the feerate range that left mempool unconfirmed after target"},
                        }},
                        {RPCResult::Type::OBJ, "fail", /*optional=*/true, "information about the highest range of feerates to fail to meet the threshold",
                        {
                            {RPCResult::Type::ELISION, "", ""},
                        }},
                        {RPCResult::Type::ARR, "errors", /*optional=*/true, "Errors encountered during processing (if there are any)",
                        {
                            {RPCResult::Type::STR, "error", ""},
                        }},
                }},
                {RPCResult::Type::OBJ, "medium", /*optional=*/true, "estimate for medium time horizon",
                {
                    {RPCResult::Type::ELISION, "", ""},
                }},
                {RPCResult::Type::OBJ, "long", /*optional=*/true, "estimate for long time horizon",
                {
                    {RPCResult::Type::ELISION, "", ""},
                }},
            }},
        RPCExamples{
            HelpExampleCli("estimaterawfee", "6 0.9")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            CBlockPolicyEstimator& fee_estimator = EnsureAnyFeeEstimator(request.context);
            const NodeContext& node = EnsureAnyNodeContext(request.context);

            CHECK_NONFATAL(node.validation_signals)->SyncWithValidationInterfaceQueue();
            unsigned int max_target = fee_estimator.HighestTargetTracked(FeeEstimateHorizon::LONG_HALFLIFE);
            unsigned int conf_target = ParseConfirmTarget(request.params[0], max_target);
            double threshold = 0.95;
            if (!request.params[1].isNull()) {
                threshold = request.params[1].get_real();
            }
            if (threshold < 0 || threshold > 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid threshold");
            }

            UniValue result(UniValue::VOBJ);

            for (const FeeEstimateHorizon horizon : ALL_FEE_ESTIMATE_HORIZONS) {
                CFeeRate feeRate;
                EstimationResult buckets;

                // Only output results for horizons which track the target
                if (conf_target > fee_estimator.HighestTargetTracked(horizon)) continue;

                feeRate = fee_estimator.estimateRawFee(conf_target, threshold, horizon, &buckets);
                UniValue horizon_result(UniValue::VOBJ);
                UniValue errors(UniValue::VARR);
                UniValue passbucket(UniValue::VOBJ);
                passbucket.pushKV("startrange", round(buckets.pass.start));
                passbucket.pushKV("endrange", round(buckets.pass.end));
                passbucket.pushKV("withintarget", round(buckets.pass.withinTarget * 100.0) / 100.0);
                passbucket.pushKV("totalconfirmed", round(buckets.pass.totalConfirmed * 100.0) / 100.0);
                passbucket.pushKV("inmempool", round(buckets.pass.inMempool * 100.0) / 100.0);
                passbucket.pushKV("leftmempool", round(buckets.pass.leftMempool * 100.0) / 100.0);
                UniValue failbucket(UniValue::VOBJ);
                failbucket.pushKV("startrange", round(buckets.fail.start));
                failbucket.pushKV("endrange", round(buckets.fail.end));
                failbucket.pushKV("withintarget", round(buckets.fail.withinTarget * 100.0) / 100.0);
                failbucket.pushKV("totalconfirmed", round(buckets.fail.totalConfirmed * 100.0) / 100.0);
                failbucket.pushKV("inmempool", round(buckets.fail.inMempool * 100.0) / 100.0);
                failbucket.pushKV("leftmempool", round(buckets.fail.leftMempool * 100.0) / 100.0);

                // CFeeRate(0) is used to indicate error as a return value from estimateRawFee
                if (feeRate != CFeeRate(0)) {
                    horizon_result.pushKV("feerate", ValueFromAmount(feeRate.GetFeePerK()));
                    horizon_result.pushKV("decay", buckets.decay);
                    horizon_result.pushKV("scale", (int)buckets.scale);
                    horizon_result.pushKV("pass", std::move(passbucket));
                    // buckets.fail.start == -1 indicates that all buckets passed, there is no fail bucket to output
                    if (buckets.fail.start != -1) horizon_result.pushKV("fail", std::move(failbucket));
                } else {
                    // Output only information that is still meaningful in the event of error
                    horizon_result.pushKV("decay", buckets.decay);
                    horizon_result.pushKV("scale", (int)buckets.scale);
                    horizon_result.pushKV("fail", std::move(failbucket));
                    errors.push_back("Insufficient data or no feerate found which meets threshold");
                    horizon_result.pushKV("errors", std::move(errors));
                }
                result.pushKV(StringForFeeEstimateHorizon(horizon), std::move(horizon_result));
            }
            return result;
        },
    };
}